

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

void __thiscall
ON_SubDComponentId::ON_SubDComponentId
          (ON_SubDComponentId *this,uint face_id,ON__UINT_PTR face_dir,
          ON_SubDFaceCornerDex face_cdex)

{
  bool bVar1;
  uint uVar2;
  ON_SubDComponentId *local_30;
  ON__UINT_PTR face_dir_local;
  uint face_id_local;
  ON_SubDComponentId *this_local;
  ON_SubDFaceCornerDex face_cdex_local;
  
  this->m_id = 0;
  this->m_type_and_dir = '\0';
  local_30 = (ON_SubDComponentId *)this->m_valueAB;
  do {
    *(uchar *)&local_30->m_id = '\0';
    local_30 = (ON_SubDComponentId *)((long)&local_30->m_id + 1);
  } while (local_30 != this + 1);
  if (face_id != 0) {
    this->m_id = face_id;
    this_local._4_4_ = face_cdex;
    Internal_SetType(this,Face);
    Internal_SetDir(this,(uint)(face_dir != 0));
    bVar1 = ON_SubDFaceCornerDex::IsSet((ON_SubDFaceCornerDex *)((long)&this_local + 4));
    if ((bVar1) &&
       (uVar2 = ON_SubDFaceCornerDex::EdgeCount((ON_SubDFaceCornerDex *)((long)&this_local + 4)),
       uVar2 < 0x1000)) {
      uVar2 = ON_SubDFaceCornerDex::CornerIndex((ON_SubDFaceCornerDex *)((long)&this_local + 4));
      Internal_SetValueA(this,uVar2);
      uVar2 = ON_SubDFaceCornerDex::EdgeCount((ON_SubDFaceCornerDex *)((long)&this_local + 4));
      Internal_SetValueB(this,uVar2);
    }
  }
  return;
}

Assistant:

ON_SubDComponentId::ON_SubDComponentId(unsigned face_id, ON__UINT_PTR face_dir, ON_SubDFaceCornerDex face_cdex)
{
  if (face_id > 0)
  {
    m_id = face_id;
    Internal_SetType(ON_SubDComponentPtr::Type::Face);
    Internal_SetDir(0 == face_dir ? 0u : 1u);
    if (face_cdex.IsSet() && face_cdex.EdgeCount() < 4096u)
    {
      Internal_SetValueA(face_cdex.CornerIndex());
      Internal_SetValueB(face_cdex.EdgeCount());
    }
  }
}